

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O2

void __thiscall imrt::Plan::newCopy(Plan *this,Plan *p)

{
  Station *pSVar1;
  mapped_type *ppSVar2;
  _List_node_base *p_Var3;
  Station *aux;
  int local_44;
  Plan *local_40;
  Station *local_38;
  
  this->last_changed = (Station *)0x0;
  std::vector<double,_std::allocator<double>_>::operator=(&this->w,&p->w);
  std::vector<double,_std::allocator<double>_>::operator=(&this->Zmin,&p->Zmin);
  std::vector<double,_std::allocator<double>_>::operator=(&this->Zmax,&p->Zmax);
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::clear(&this->stations);
  p_Var3 = (_List_node_base *)&p->stations;
  local_40 = this;
  while (p_Var3 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                   &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var3 != (_List_node_base *)&p->stations) {
    pSVar1 = (Station *)operator_new(0x170);
    Station::Station(pSVar1,(Station *)p_Var3[1]._M_next);
    if ((p->last_changed != (Station *)0x0) && (p->last_changed->angle == pSVar1->angle)) {
      local_40->last_changed = pSVar1;
    }
    local_38 = pSVar1;
    std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::push_back
              (&this->stations,&local_38);
    pSVar1 = local_38;
    local_44 = local_38->angle;
    ppSVar2 = std::
              map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
              ::operator[](&this->angle2station,&local_44);
    *ppSVar2 = pSVar1;
  }
  local_40->evaluation_fx = p->evaluation_fx;
  return;
}

Assistant:

void Plan::newCopy(Plan& p) {
    last_changed=NULL;
    //ev= EvaluationFunction::getInstance();

    w=p.w;
    Zmin=p.Zmin;
    Zmax=p.Zmax;
    stations.clear();
    //real_stations.clear();
    for (list<Station*>::const_iterator it=p.stations.begin();it!=p.stations.end();it++) {
      Station* aux = new Station (**it);
      if (p.last_changed!=NULL && p.last_changed->getAngle()==aux->getAngle()) last_changed=aux;
      stations.push_back(aux);
      angle2station[aux->getAngle()]=aux;
      //real_stations.push_back(*aux);
    }
    evaluation_fx=p.evaluation_fx;
  }